

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panes.c
# Opt level: O2

void hex_driver(void *user_data,wchar_t input)

{
  byte bVar1;
  buffer_t *buffer;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  cursor_t cVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  byte bVar15;
  wchar_t width;
  bool bVar16;
  wchar_t error;
  
  if (_stdscr == 0) {
    width = L'\xffffffff';
  }
  else {
    width = *(short *)(_stdscr + 4) + L'\x01';
  }
  buffer = *user_data;
  uVar7 = *(ulong *)((long)user_data + 0x10);
  lVar14 = uVar7 * 0x10;
  uVar9 = width + L'\xfffffffd';
  uVar10 = (ulong)uVar9;
  lVar13 = (int)(uVar9 * 0x10) + lVar14;
  switch(input) {
  case L'\x1b':
    if (*(int *)((long)user_data + 0xc) != 0) {
      nodelay(_stdscr,1);
      iVar3 = wgetch(_stdscr);
      if (iVar3 == -1) {
        *(undefined4 *)((long)user_data + 0xc) = 0;
      }
      else {
        ungetch(iVar3);
      }
      nodelay(_stdscr,0);
      uVar10 = extraout_RDX_01;
    }
    break;
  case L'\x1c':
  case L'\x1d':
  case L'\x1e':
  case L'\x1f':
  case L' ':
  case L'!':
  case L'\"':
  case L'#':
  case L'$':
  case L'%':
  case L'&':
  case L'\'':
  case L'(':
  case L')':
  case L'*':
  case L',':
  case L'.':
  case L'/':
    break;
  case L'+':
    buffer_bookmark_push(buffer,buffer->cursor);
    uVar10 = extraout_RDX_00;
    break;
  case L'-':
    uVar6 = buffer_bookmark_pop(buffer,0x10,width,&error);
    uVar10 = extraout_RDX;
    if (error == L'\0') {
      *(uint64_t *)((long)user_data + 0x10) = uVar6;
    }
    break;
  case L'0':
  case L'1':
  case L'2':
  case L'3':
  case L'4':
  case L'5':
  case L'6':
  case L'7':
  case L'8':
  case L'9':
switchD_0010405b_caseD_61:
    if (*(int *)((long)user_data + 0xc) == 0) break;
    bVar1 = buffer->data[buffer->cursor];
    bVar15 = bVar1 >> 4;
    uVar11 = (uint)(byte)((char)input + 0xa9);
    if ((uint)(input + L'\xffffffd0') < 10) {
      uVar11 = input + L'\xffffffd0';
    }
    bVar2 = (byte)uVar11;
    if (*(int *)((long)user_data + 8) == 0) {
      bVar15 = bVar2;
      bVar2 = bVar1 & 0xf;
    }
    buffer->data[buffer->cursor] = bVar15 << 4 | bVar2;
switchD_0010405b_caseD_6c:
    sVar4 = buffer->size;
    uVar7 = buffer->cursor;
    if (uVar7 < sVar4 - 1) {
      iVar3 = *(int *)((long)user_data + 8);
      if ((iVar3 == 1) || (*(int *)((long)user_data + 0xc) == 0)) {
        uVar7 = uVar7 + 1;
        buffer->cursor = uVar7;
      }
      *(uint *)((long)user_data + 8) = (uint)(iVar3 == 0);
    }
    else if ((uVar7 == sVar4 - 1) && (*(int *)((long)user_data + 8) == 0)) {
      *(undefined4 *)((long)user_data + 8) = 1;
    }
    if ((uVar7 & 0xfffffffffffffff0) <= lVar13 - 0x20U) break;
    uVar7 = *(ulong *)((long)user_data + 0x10);
LAB_0010418c:
    uVar10 = (long)(int)uVar9 + uVar7;
    if (sVar4 >> 4 <= uVar10) break;
    lVar13 = uVar7 + 1;
    goto LAB_00104346;
  default:
    switch(input) {
    case L'a':
    case L'b':
    case L'c':
    case L'd':
    case L'e':
    case L'f':
      goto switchD_0010405b_caseD_61;
    case L'g':
    case L'i':
    case L'm':
    case L'n':
    case L'o':
    case L'p':
    case L'q':
    case L'r':
    case L's':
    case L't':
    case L'u':
      break;
    case L'h':
switchD_0010405b_caseD_68:
      cVar5 = buffer->cursor;
      uVar9 = *(uint *)((long)user_data + 8);
      uVar10 = (ulong)uVar9;
      if (cVar5 == 0) {
        if (uVar9 != 0) {
          *(undefined4 *)((long)user_data + 8) = 0;
        }
        uVar8 = 0;
      }
      else {
        if ((uVar9 == 0) || (*(int *)((long)user_data + 0xc) == 0)) {
          cVar5 = cVar5 - 1;
          buffer->cursor = cVar5;
        }
        *(uint *)((long)user_data + 8) = (uint)(uVar9 == 0);
        uVar8 = cVar5 & 0xfffffffffffffff0;
      }
      bVar16 = uVar8 < lVar14 + 0x20U;
      goto LAB_00104336;
    case L'j':
switchD_0010405b_caseD_6a:
      sVar4 = buffer->size;
      uVar12 = buffer->cursor + 0x10;
      uVar8 = sVar4 - 1;
      if (uVar12 < sVar4) {
        uVar8 = uVar12;
      }
      buffer->cursor = uVar8;
      if ((uVar8 & 0xfffffffffffffff0) <= lVar13 - 0x20U) break;
      goto LAB_0010418c;
    case L'k':
switchD_0010405b_caseD_6b:
      uVar10 = buffer->cursor - 0x10;
      uVar8 = 0;
      if (0xf < buffer->cursor) {
        uVar8 = uVar10;
      }
      buffer->cursor = uVar8;
      bVar16 = (uVar8 & 0xfffffffffffffff0) < lVar14 + 0x20U;
LAB_00104336:
      uVar10 = CONCAT71((int7)(uVar10 >> 8),uVar7 == 0 || !bVar16);
      if (uVar7 != 0 && bVar16) {
        lVar13 = uVar7 - 1;
LAB_00104346:
        *(long *)((long)user_data + 0x10) = lVar13;
      }
      break;
    case L'l':
      goto switchD_0010405b_caseD_6c;
    case L'v':
      if (*(int *)((long)user_data + 0xc) == 0) {
        if (buffer->start_mark == 0xffffffffffffffff) {
          buffer->start_mark = buffer->cursor;
        }
        else if (buffer->end_mark == 0xffffffffffffffff) {
          buffer->end_mark = buffer->cursor;
        }
        else {
          *(undefined4 *)&buffer->start_mark = 0xffffffff;
          *(undefined4 *)((long)&buffer->start_mark + 4) = 0xffffffff;
          *(undefined4 *)&buffer->end_mark = 0xffffffff;
          *(undefined4 *)((long)&buffer->end_mark + 4) = 0xffffffff;
        }
      }
      break;
    default:
      switch(input) {
      case L'Ă':
        goto switchD_0010405b_caseD_6a;
      case L'ă':
        goto switchD_0010405b_caseD_6b;
      case L'Ą':
        goto switchD_0010405b_caseD_68;
      case L'ą':
        goto switchD_0010405b_caseD_6c;
      case L'Ć':
        *(undefined8 *)((long)user_data + 0x10) = 0;
        buffer->cursor = 0;
        *(undefined4 *)((long)user_data + 8) = 0;
        break;
      case L'ć':
      case L'Ĉ':
      case L'ĉ':
      case L'Ċ':
        break;
      case L'ċ':
        if ((*(int *)((long)user_data + 0xc) == 0) && (buffer->editable != 0)) {
          *(undefined4 *)((long)user_data + 0xc) = 1;
        }
        break;
      default:
        if (input == L'Œ') {
          uVar8 = uVar7 + (long)(int)uVar9;
          uVar7 = buffer->size;
          uVar10 = uVar7 >> 4;
          if (uVar8 < uVar10) goto LAB_001042f7;
        }
        else {
          if (input == L'œ') {
            uVar8 = uVar7 - (long)(int)uVar9;
            if (uVar7 < (ulong)(long)(int)uVar9) {
              *(undefined8 *)((long)user_data + 0x10) = 0;
              buffer->cursor = 0;
              break;
            }
LAB_001042f7:
            *(ulong *)((long)user_data + 0x10) = uVar8;
            buffer->cursor = uVar8 << 4;
            break;
          }
          if (input != L'Ũ') break;
          uVar7 = buffer->size;
          uVar10 = uVar7 >> 4;
        }
        *(ulong *)((long)user_data + 0x10) = (long)(3 - width) + uVar10;
        buffer->cursor = uVar7 - 1;
        *(undefined4 *)((long)user_data + 8) = 1;
      }
    }
  }
  hex_update((hex_pane_t *)user_data,width,(wchar_t)uVar10);
  return;
}

Assistant:

static void
hex_driver(void *user_data, int input)
{
    hex_pane_t *pane = (hex_pane_t*) user_data;
    buffer_t *buffer = pane->buffer;

    int height, width;
    getmaxyx(stdscr, height, width);
    width = 16;

    cursor_t top = pane->scroll * width;
    cursor_t bottom = top + (height - 3) * width;

    switch (input) {
    case 'h':
    case KEY_LEFT:
        if (buffer->cursor > 0) {
            if (pane->odd == 0 || !pane->edit) {
                buffer->cursor--;
            }
            pane->odd = !pane->odd;
        } else if (buffer->cursor == 0 && pane->odd) {
            // If the user is on the second nibble of the buffer and moves to
            // the left.
            //
            pane->odd = 0;
        }

        // If moving the cursor caused it to move off the screen, overflow scroll
        // upwards.
        //
        if (buffer->cursor - (buffer->cursor % width) < (top + width * 2)) {
            // If scrolling won't go off the screen.
            //
            if (pane->scroll > 0) {
                pane->scroll--;
            }
        }
        break;
    case 'j':
    case KEY_DOWN:
        if (buffer->cursor + width < buffer->size) {
            buffer->cursor += width;
        } else {
            // If on last row: snap cursor to end of the buffer.
            //
            buffer->cursor = buffer->size - 1;
        }

        // If overflow scrolled off the screen, seek downwards.
        //
        if (buffer->cursor - (buffer->cursor % width) > (bottom - width * 2)) {
            // If scrolling won't go off the screen.
            //
            if (pane->scroll + height - 3 < buffer->size / width) {
                pane->scroll++;
            }
        }
        break;
advance:
    case 'l':
    case KEY_RIGHT:
        if (buffer->cursor < buffer->size - 1) {
            if (pane->odd == 1 || !pane->edit) {
                buffer->cursor++;
            }
            pane->odd = !pane->odd;
        } else if (buffer->cursor == buffer->size - 1 && !pane->odd) {
            // If the user is on the 2nd last nibble of the buffer and moves to
            // the right.
            //
            pane->odd = 1;
        }

        // If moving the cursor caused it to move off the screen, overflow scroll
        // downwards.
        //
        if (buffer->cursor - (buffer->cursor % width) > (bottom - width * 2)) {
            // If scrolling won't go off the screen.
            //
            if (pane->scroll + height - 3 < buffer->size / width) {
                pane->scroll++;
            }
        }
        break;
    case 'k':
    case KEY_UP:
        if (buffer->cursor >= width) {
            buffer->cursor -= width;
        } else {
            // If on 1st row: snap cursor to the beginning of the buffer.
            //
            buffer->cursor = 0;
        }

        // If overflow scrolled off the screen, seek upwards.
        //
        if (buffer->cursor - (buffer->cursor % width) < (top + width * 2)) {
            // If scrolling won't go off the screen.
            //
            if (pane->scroll > 0) {
                pane->scroll--;
            }
        }
        break;
    case KEY_PPAGE:
        // If scrolling would send the cursor off the screen, reset to the
        // beginning.
        //
        if (pane->scroll < height - 3) {
            pane->scroll = 0;
            buffer->cursor = 0;
        } else {
            pane->scroll -= height - 3;
            buffer->cursor = pane->scroll * width;
        }
        break;
    case KEY_NPAGE:
        // If scrolling would send the cursor out of bounds, set the cursor
        // to the end of the buffer.
        //
        if (pane->scroll + height - 3 >= buffer->size / width) {
            goto end;
        } else {
            pane->scroll += height - 3;
            buffer->cursor = pane->scroll * width;
        }
        break;
end:
    case KEY_END:
        pane->scroll = buffer->size / width - height + 3;
        buffer->cursor = buffer->size - 1;
        pane->odd = 1;
        break;
    case KEY_HOME:
        pane->scroll = 0;
        buffer->cursor = 0;
        pane->odd = 0;
        break;
    case 'v':
        // No selection supported inside of edit mode.
        //
        if (pane->edit)
            break;

        if (buffer->start_mark == -1) {
            buffer->start_mark = buffer->cursor;
        } else if (buffer->end_mark == -1 && buffer->start_mark != -1) {
            buffer->end_mark = buffer->cursor;
        } else if (buffer->end_mark != -1 && buffer->start_mark != -1) {
            buffer->start_mark = -1;
            buffer->end_mark = -1;
        }
        break;
    case KEY_F(3):
        if (!pane->edit && buffer->editable) {
            pane->edit = 1;
        }
        break;
    case '\x1b': {
        // If in edit mode and ESC is hit, disable edit mode.
        //
        if (!pane->edit)
            break;

        nodelay(stdscr, TRUE);
        int n;
        if ((n = getch()) == ERR) {
            pane->edit = 0;
        } else {
            ungetch(n);
        }
        nodelay(stdscr, FALSE);
    } break;
    case 'a'...'f':
    case '0'...'9': {
        if (!pane->edit)
            break;

        // Convert character to integral representation.
        //
        int n;
        if (input >= '0' && input <= '9') {
            n = input - '0';
        } else if (input >= 'a' && input <= 'f') {
            n = 10 + input - 'a';
        }

        uint8_t b = buffer->data[buffer->cursor];
        uint8_t st = b & 0x0f;
        uint8_t nd = (b & 0xf0) >> 4;

        if (pane->odd) {
            st = n;
        } else {
            nd = n;
        }

        buffer->data[buffer->cursor] = ((nd << 4) | st);
        goto advance;
    } break;
    case '+':
        buffer_bookmark_push(buffer, buffer->cursor);
        break;
    case '-': {
        int error;
        uint64_t scroll = buffer_bookmark_pop(buffer, width, height, &error);
        if (!error) {
            pane->scroll = scroll;
        }
    } break;
    }

    hex_update(pane, width, height);
}